

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<unsigned_short>::Seal
          (ES5ArrayTypeHandlerBase<unsigned_short> *this,DynamicObject *instance)

{
  IndexPropertyDescriptorMap *this_00;
  BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar1;
  BOOL BVar2;
  IndexPropertyDescriptor *descriptor;
  IndexPropertyDescriptor *pIVar3;
  int i;
  int i_00;
  
  for (i_00 = 0; this_00 = (this->indexPropertyMap).ptr, pBVar1 = (this_00->indexPropertyMap).ptr,
      i_00 < pBVar1->count - pBVar1->freeCount; i_00 = i_00 + 1) {
    pIVar3 = IndexPropertyDescriptorMap::GetReferenceAt(this_00,i_00);
    pIVar3->Attributes = pIVar3->Attributes & 0xfd;
  }
  this->dataItemAttributes = this->dataItemAttributes & 0xfd;
  BVar2 = DictionaryTypeHandlerBase<unsigned_short>::Seal
                    (&this->super_DictionaryTypeHandlerBase<unsigned_short>,instance);
  return BVar2;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::Seal(DynamicObject* instance)
    {
        IndexPropertyDescriptor* descriptor = NULL;
        for (int i = 0; i < indexPropertyMap->Count(); i++)
        {
            descriptor = indexPropertyMap->GetReferenceAt(i);
            descriptor->Attributes &= (~PropertyConfigurable);
        }

        this->SetDataItemSealed(); // set shared data item attributes sealed

        return __super::Seal(instance);
    }